

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCofInt(Gia_Man_t *p,int iVar)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  Gia_Obj_t *pGVar15;
  undefined4 in_register_00000034;
  long lVar16;
  long lVar17;
  uint local_4c;
  
  if (iVar < 1 || p->nObjs <= iVar) {
    p_00 = (Gia_Man_t *)0x0;
    printf("Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n",
           CONCAT44(in_register_00000034,iVar),0);
  }
  else {
    pGVar12 = p->pObjs;
    uVar9 = *(uint *)(pGVar12 + (uint)iVar);
    if (((uVar9 & 0x9fffffff) == 0x9fffffff) || (-1 < (int)uVar9 && (~uVar9 & 0x1fffffff) != 0)) {
      p_00 = Gia_ManStart(p->nObjs);
      pcVar3 = p->pName;
      if (pcVar3 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar3);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar3);
      }
      p_00->pName = pcVar11;
      pcVar3 = p->pSpec;
      if (pcVar3 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar3);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar3);
      }
      pGVar12 = pGVar12 + (uint)iVar;
      p_00->pSpec = pcVar11;
      Gia_ManHashAlloc(p_00);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      pVVar14 = p->vCis;
      if (pVVar14->nSize < 1) {
        local_4c = 0xffffffff;
      }
      else {
        local_4c = 0xffffffff;
        lVar16 = 0;
        do {
          iVar8 = pVVar14->pArray[lVar16];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00717301;
          pGVar15 = p->pObjs;
          if (pGVar15 == (Gia_Obj_t *)0x0) break;
          pGVar13 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar13 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar13)) {
LAB_00717320:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar13)) goto LAB_00717320;
          pGVar15 = pGVar15 + iVar8;
          uVar7 = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
          uVar9 = uVar7;
          if (pGVar15 == pGVar12) {
            uVar9 = 0;
            local_4c = uVar7;
          }
          pGVar15->Value = uVar9;
          lVar16 = lVar16 + 1;
          pVVar14 = p->vCis;
        } while (lVar16 < pVVar14->nSize);
      }
      iVar8 = p->nObjs;
      if (0 < iVar8) {
        lVar17 = 0;
        lVar16 = 0;
        do {
          pGVar15 = p->pObjs;
          if (pGVar15 == (Gia_Obj_t *)0x0) break;
          uVar4 = *(ulong *)(&pGVar15->field_0x0 + lVar17);
          if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
            uVar9 = *(uint *)((long)pGVar15 +
                             lVar17 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3 + 8);
            if (((int)uVar9 < 0) ||
               (uVar7 = *(uint *)((long)pGVar15 +
                                 lVar17 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + 8),
               (int)uVar7 < 0)) goto LAB_0071733f;
            uVar7 = Gia_ManHashAnd(p_00,uVar9 ^ (uint)(uVar4 >> 0x1d) & 1,
                                   uVar7 ^ (uint)(uVar4 >> 0x3d) & 1);
            uVar9 = uVar7;
            if ((Gia_Obj_t *)(&pGVar15->field_0x0 + lVar17) == pGVar12) {
              uVar9 = 0;
              local_4c = uVar7;
            }
            *(uint *)((long)&pGVar15->Value + lVar17) = uVar9;
            iVar8 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar16 < iVar8);
      }
      lVar16 = (long)p->vCos->nSize;
      if (0 < lVar16) {
        piVar6 = p->vCos->pArray;
        lVar17 = 0;
        do {
          iVar1 = piVar6[lVar17];
          if (((long)iVar1 < 0) || (iVar8 <= iVar1)) goto LAB_00717301;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar15 = p->pObjs + iVar1;
          if ((int)pGVar15[-(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff)].Value < 0)
          goto LAB_0071733f;
          pGVar15->Value =
               (uint)*(undefined8 *)pGVar15 >> 0x1d & 1 ^
               pGVar15[-(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff)].Value;
          lVar17 = lVar17 + 1;
        } while (lVar16 != lVar17);
      }
      pVVar14 = p->vCis;
      if (0 < pVVar14->nSize) {
        lVar16 = 0;
        do {
          iVar1 = pVVar14->pArray[lVar16];
          if (((long)iVar1 < 0) || (iVar8 <= iVar1)) goto LAB_00717301;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (p_00->vCis->nSize <= lVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = p_00->vCis->pArray[lVar16];
          if ((iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_00717301;
          pGVar15 = p->pObjs + iVar1;
          uVar9 = iVar2 * 2;
          if (pGVar15 == pGVar12) {
            uVar9 = 1;
          }
          pGVar15->Value = uVar9;
          lVar16 = lVar16 + 1;
          pVVar14 = p->vCis;
        } while (lVar16 < pVVar14->nSize);
        iVar8 = p->nObjs;
      }
      if (0 < iVar8) {
        lVar17 = 0;
        lVar16 = 0;
        do {
          pGVar15 = p->pObjs;
          if (pGVar15 == (Gia_Obj_t *)0x0) break;
          uVar4 = *(ulong *)(&pGVar15->field_0x0 + lVar17);
          if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
            uVar9 = *(uint *)((long)pGVar15 +
                             lVar17 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3 + 8);
            if (((int)uVar9 < 0) ||
               (uVar7 = *(uint *)((long)pGVar15 +
                                 lVar17 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + 8),
               (int)uVar7 < 0)) goto LAB_0071733f;
            iVar8 = Gia_ManHashAnd(p_00,uVar9 ^ (uint)(uVar4 >> 0x1d) & 1,
                                   uVar7 ^ (uint)(uVar4 >> 0x3d) & 1);
            if ((Gia_Obj_t *)(&pGVar15->field_0x0 + lVar17) == pGVar12) {
              iVar8 = 1;
            }
            *(int *)((long)&pGVar15->Value + lVar17) = iVar8;
            iVar8 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar16 < iVar8);
      }
      if ((int)local_4c < 1) {
        __assert_fail("iCofVar > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                      ,0x346,"Gia_Man_t *Gia_ManDupCofInt(Gia_Man_t *, int)");
      }
      pVVar14 = p->vCos;
      if (0 < pVVar14->nSize) {
        lVar16 = 0;
        do {
          lVar17 = (long)pVVar14->pArray[lVar16];
          if ((lVar17 < 0) || (p->nObjs <= pVVar14->pArray[lVar16])) {
LAB_00717301:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar12 = p->pObjs;
          if (pGVar12 == (Gia_Obj_t *)0x0) break;
          pGVar15 = pGVar12 + lVar17;
          if ((int)pGVar15[-(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff)].Value < 0) {
LAB_0071733f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar9 = pGVar12[lVar17].Value;
          uVar7 = (uint)*(undefined8 *)pGVar15 >> 0x1d & 1 ^
                  pGVar15[-(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff)].Value;
          if (uVar9 != uVar7) {
            uVar9 = Gia_ManHashMux(p_00,local_4c,uVar7,uVar9);
          }
          uVar9 = Gia_ManAppendCo(p_00,uVar9);
          pGVar15->Value = uVar9;
          lVar16 = lVar16 + 1;
          pVVar14 = p->vCos;
        } while (lVar16 < pVVar14->nSize);
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
    }
    else {
      p_00 = (Gia_Man_t *)0x0;
      printf("Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n");
    }
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCofInt( Gia_Man_t * p, int iVar )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pPivot;
    int i, iCofVar = -1;
    if ( !(iVar > 0 && iVar < Gia_ManObjNum(p)) )
    {
        printf( "Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n", iVar, 0, Gia_ManObjNum(p) );
        return NULL;
    }
    // find the cofactoring variable
    pPivot = Gia_ManObj( p, iVar );
    if ( !Gia_ObjIsCand(pPivot) )
    {
        printf( "Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n", iVar );
        return NULL;
    }
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // compute negative cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // compute the positive cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Abc_Var2Lit( Gia_ObjId(pNew, Gia_ManCi(pNew, i)), 0 );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    // create MUXes
    assert( iCofVar > 0 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( pObj->Value == (unsigned)Gia_ObjFanin0Copy(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ManHashMux(pNew, iCofVar, Gia_ObjFanin0Copy(pObj), pObj->Value) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}